

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int parse_node_identifier
              (char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,int *all_desc,
              int extended)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *first_id;
  int first_id_len;
  int all_desc_local;
  int ret;
  int parsed;
  int *all_desc_local_1;
  int *nam_len_local;
  char **name_local;
  int *mod_name_len_local;
  char **mod_name_local;
  char *id_local;
  
  first_id._4_4_ = 0;
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,199,
                  "int parse_node_identifier(const char *, const char **, int *, const char **, int *, int *, int)"
                 );
  }
  if (((mod_name == (char **)0x0) || (mod_name_len == (int *)0x0)) &&
     ((mod_name != (char **)0x0 || (mod_name_len != (int *)0x0)))) {
    __assert_fail("(mod_name && mod_name_len) || (!mod_name && !mod_name_len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,200,
                  "int parse_node_identifier(const char *, const char **, int *, const char **, int *, int *, int)"
                 );
  }
  if (((name == (char **)0x0) || (nam_len == (int *)0x0)) &&
     ((name != (char **)0x0 || (nam_len != (int *)0x0)))) {
    __assert_fail("(name && nam_len) || (!name && !nam_len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xc9,
                  "int parse_node_identifier(const char *, const char **, int *, const char **, int *, int *, int)"
                 );
  }
  if (mod_name != (char **)0x0) {
    *mod_name = (char *)0x0;
    *mod_name_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
    *nam_len = 0;
  }
  if (extended != 0) {
    if (*id == '/') {
      if (all_desc != (int *)0x0) {
        *all_desc = 1;
      }
      first_id._4_4_ = 1;
    }
    else if (all_desc != (int *)0x0) {
      *all_desc = 0;
    }
    uVar1 = parse_identifier(id + first_id._4_4_);
    if ((int)uVar1 < 1) {
      first_id_len = first_id._4_4_;
    }
    else {
      if (id[(int)(first_id._4_4_ + uVar1)] != ':') goto LAB_00114d02;
      if (mod_name != (char **)0x0) {
        *mod_name = id + first_id._4_4_;
        *mod_name_len = uVar1;
      }
      first_id_len = first_id._4_4_ + 1 + uVar1;
    }
    if (id[first_id_len] == '*') {
      if (name != (char **)0x0) {
        *name = id + first_id_len;
        *nam_len = 1;
      }
      return first_id_len + 1;
    }
    if (id[first_id_len] == '.') {
      if (first_id._4_4_ == 0) {
        return -first_id_len;
      }
      if (name != (char **)0x0) {
        *name = id + first_id_len;
        *nam_len = 1;
      }
      return first_id_len + 1;
    }
    if (id[first_id_len] == '#') {
      if ((first_id._4_4_ == 0) && (first_id_len != 0)) {
        iVar2 = first_id_len + 1;
        uVar1 = parse_identifier(id + iVar2);
        if ((int)uVar1 < 1) {
          return uVar1 - iVar2;
        }
        *name = id + (long)iVar2 + -1;
        *nam_len = uVar1 + 1;
        return iVar2 + uVar1;
      }
      return 0;
    }
  }
LAB_00114d02:
  id_local._4_4_ = parse_identifier(id);
  if (0 < (int)id_local._4_4_) {
    pcVar3 = id + (int)id_local._4_4_;
    if (*pcVar3 == ':') {
      uVar1 = parse_identifier(pcVar3 + 1);
      if ((int)uVar1 < 1) {
        id_local._4_4_ = uVar1 - (id_local._4_4_ + 1);
      }
      else {
        if (mod_name != (char **)0x0) {
          *mod_name = id;
          *mod_name_len = id_local._4_4_;
        }
        if (name != (char **)0x0) {
          *name = pcVar3 + 1;
          *nam_len = uVar1;
        }
        id_local._4_4_ = id_local._4_4_ + 1 + uVar1;
      }
    }
    else if (name != (char **)0x0) {
      *name = id;
      *nam_len = id_local._4_4_;
    }
  }
  return id_local._4_4_;
}

Assistant:

static int
parse_node_identifier(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                      int *all_desc, int extended)
{
    int parsed = 0, ret, all_desc_local = 0, first_id_len;
    const char *first_id;

    assert(id);
    assert((mod_name && mod_name_len) || (!mod_name && !mod_name_len));
    assert((name && nam_len) || (!name && !nam_len));

    if (mod_name) {
        *mod_name = NULL;
        *mod_name_len = 0;
    }
    if (name) {
        *name = NULL;
        *nam_len = 0;
    }

    if (extended) {
        /* try to parse only the extended expressions */
        if (id[parsed] == '/') {
            if (all_desc) {
                *all_desc = 1;
            }
            all_desc_local = 1;
        } else {
            if (all_desc) {
                *all_desc = 0;
            }
        }

        /* is there a prefix? */
        ret = parse_identifier(id + all_desc_local);
        if (ret > 0) {
            if (id[all_desc_local + ret] != ':') {
                /* this is not a prefix, so not an extended id */
                goto standard_id;
            }

            if (mod_name) {
                *mod_name = id + all_desc_local;
                *mod_name_len = ret;
            }

            /* "/" and ":" */
            ret += all_desc_local + 1;
        } else {
            ret = all_desc_local;
        }

        /* parse either "*" or "." */
        if (*(id + ret) == '*') {
            if (name) {
                *name = id + ret;
                *nam_len = 1;
            }
            ++ret;

            return ret;
        } else if (*(id + ret) == '.') {
            if (!all_desc_local) {
                /* /. is redundant expression, we do not accept it */
                return -ret;
            }

            if (name) {
                *name = id + ret;
                *nam_len = 1;
            }
            ++ret;

            return ret;
        } else if (*(id + ret) == '#') {
            if (all_desc_local || !ret) {
                /* no prefix */
                return 0;
            }
            parsed = ret + 1;
            if ((ret = parse_identifier(id + parsed)) < 1) {
                return -parsed + ret;
            }
            *name = id + parsed - 1;
            *nam_len = ret + 1;
            return parsed + ret;
        }
        /* else a standard id, parse it all again */
    }

standard_id:
    if ((ret = parse_identifier(id)) < 1) {
        return ret;
    }

    first_id = id;
    first_id_len = ret;

    parsed += ret;
    id += ret;

    /* there is prefix */
    if (id[0] == ':') {
        ++parsed;
        ++id;

    /* there isn't */
    } else {
        if (name) {
            *name = first_id;
            *nam_len = first_id_len;
        }

        return parsed;
    }

    /* identifier (node name) */
    if ((ret = parse_identifier(id)) < 1) {
        return -parsed + ret;
    }

    if (mod_name) {
        *mod_name = first_id;
        *mod_name_len = first_id_len;
    }
    if (name) {
        *name = id;
        *nam_len = ret;
    }

    return parsed + ret;
}